

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.cpp
# Opt level: O2

string * __thiscall
duckdb::TableFilter::DebugToString_abi_cxx11_(string *__return_storage_ptr__,TableFilter *this)

{
  allocator local_39;
  string local_38 [32];
  
  ::std::__cxx11::string::string(local_38,"c0",&local_39);
  (*this->_vptr_TableFilter[3])(__return_storage_ptr__,this,local_38);
  ::std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

string TableFilter::DebugToString() const {
	return ToString("c0");
}